

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O0

boolean teleport_pet(monst *mtmp,boolean force_it)

{
  obj *poVar1;
  obj *otmp;
  boolean force_it_local;
  monst *mtmp_local;
  
  if (mtmp == u.usteed) {
    mtmp_local._7_1_ = '\0';
  }
  else if ((*(uint *)&mtmp->field_0x60 >> 0x18 & 1) == 0) {
    mtmp_local._7_1_ = '\x01';
  }
  else {
    poVar1 = get_mleash(mtmp);
    if (poVar1 == (obj *)0x0) {
      Monnam(mtmp);
      warning("%s is leashed, without a leash.");
    }
    else {
      if (((*(uint *)&poVar1->field_0x4a & 1) != 0) && (force_it == '\0')) {
        yelp(mtmp);
        return '\0';
      }
      pline("Your leash goes slack.");
    }
    m_unleash(mtmp,'\0');
    mtmp_local._7_1_ = '\x01';
  }
  return mtmp_local._7_1_;
}

Assistant:

boolean teleport_pet(struct monst *mtmp, boolean force_it)
{
	struct obj *otmp;

	if (mtmp == u.usteed)
		return FALSE;

	if (mtmp->mleashed) {
	    otmp = get_mleash(mtmp);
	    if (!otmp) {
		warning("%s is leashed, without a leash.", Monnam(mtmp));
		goto release_it;
	    }
	    if (otmp->cursed && !force_it) {
		yelp(mtmp);
		return FALSE;
	    } else {
		pline("Your leash goes slack.");
 release_it:
		m_unleash(mtmp, FALSE);
		return TRUE;
	    }
	}
	return TRUE;
}